

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::
     TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  idx_t extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  interval_t input;
  data_t local_30 [12];
  
  lVar2 = chunk_start - (long)stats;
  if (stats <= chunk_start && lVar2 != 0) {
    p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&(col->type).id_ + (long)stats * 0x10);
    do {
      input.micros = chunk_start;
      input._0_8_ = p_Var1->_M_pi;
      local_30 = (data_t  [12])
                 ParquetIntervalOperator::
                 Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                           ((ParquetIntervalOperator *)
                            ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                            (p_Var1 + -1))->_M_ptr,input);
      (*(code *)**(undefined8 **)chunk_end)(chunk_end,local_30,0xc);
      p_Var1 = p_Var1 + 2;
      lVar2 = lVar2 + -1;
      chunk_start = extraout_RDX;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}